

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationSingleQueueTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::synchronization::anon_unknown_2::SemaphoreTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SemaphoreTestInstance *this)

{
  VkPhysicalDevice pVVar1;
  DeviceInterface *vk;
  MultiQueues *this_00;
  long *plVar2;
  OperationContext *context;
  VkDevice device;
  pointer pQVar3;
  VkQueueFlags flagsWrite;
  VkQueueFlags flagsRead;
  uint uVar4;
  uint uVar5;
  VkResult VVar6;
  int iVar7;
  Resource *pRVar8;
  VkAccessFlags extraout_var;
  VkAccessFlags extraout_var_00;
  undefined4 extraout_var_01;
  void *__s1;
  void *__s2;
  long lVar9;
  ulong uVar10;
  allocator<char> local_239;
  VkCommandBuffer cmdBuffers [2];
  VkPipelineStageFlags stageBits [1];
  UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
  resource;
  UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  readOp;
  UniquePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  writeOp;
  SyncInfo local_1d8;
  SyncInfo local_1c8;
  string local_1b8;
  undefined8 uStack_198;
  VkPipelineStageFlags local_190;
  VkCommandBuffer *local_188;
  VkPipelineStageFlags local_180;
  RefBase<vk::Handle<(vk::HandleType)4>_> *local_178;
  undefined4 local_170 [2];
  undefined8 local_168;
  VkPipelineStageFlags local_160;
  RefBase<vk::Handle<(vk::HandleType)4>_> *local_158;
  VkPipelineStageFlags *local_150;
  VkPipelineStageFlags local_148;
  VkCommandBuffer *local_140;
  undefined4 local_138;
  undefined8 local_130;
  VkDevice local_128;
  ResourceDescription *local_120;
  pointer local_118;
  vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  queuePairs;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_f8;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool [2];
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  string local_50;
  
  pVVar1 = (this->super_BaseTestInstance).m_opContext.m_physicalDevice;
  vk = *(DeviceInterface **)(pVVar1 + 8);
  local_128 = *(VkDevice *)(pVVar1 + 0x18);
  this_00 = (MultiQueues *)(this->super_BaseTestInstance).m_opContext.m_vki;
  flagsWrite = (**(code **)(*(long *)(this->super_BaseTestInstance).m_resource.
                                     super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                     .m_data.ptr + 0x18))();
  plVar2 = *(long **)&(this->super_BaseTestInstance).m_resource.
                      super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                      .m_data.field_0x8;
  flagsRead = (**(code **)(*plVar2 + 0x18))
                        (plVar2,(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  MultiQueues::getQueuesPairs(&queuePairs,this_00,flagsWrite,flagsRead);
  local_120 = (ResourceDescription *)&(this->super_BaseTestInstance).m_opContext.m_allocator;
  uVar10 = 0;
  do {
    pQVar3 = queuePairs.
             super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((((long)queuePairs.
                super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)queuePairs.
               super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffffU) <= uVar10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"OK",(allocator<char> *)cmdPool);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      break;
    }
    pRVar8 = (Resource *)operator_new(0x80);
    context = (OperationContext *)(this->super_BaseTestInstance).m_opContext.m_physicalDevice;
    uVar4 = (**(code **)(*(long *)(this->super_BaseTestInstance).m_resource.
                                  super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                  .m_data.ptr + 0x10))();
    uVar5 = (**(code **)(**(long **)&(this->super_BaseTestInstance).m_resource.
                                     super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                     .m_data.field_0x8 + 0x10))();
    local_1b8._M_dataplus._M_p = (pointer)0x0;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_allocated_capacity = 0;
    Resource::Resource(pRVar8,context,local_120,uVar5 | uVar4,VK_SHARING_MODE_EXCLUSIVE,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b8);
    resource.
    super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
    .m_data.ptr = pRVar8;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b8);
    pRVar8 = (this->super_BaseTestInstance).m_resource.
             super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
             .m_data.ptr;
    (**(code **)(*(long *)pRVar8 + 0x28))
              (&local_1b8,pRVar8,(this->super_BaseTestInstance).m_opContext.m_physicalDevice,
               resource.
               super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
               .m_data.ptr);
    device = local_128;
    writeOp.
    super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    .m_data.ptr = (Operation *)local_1b8._M_dataplus._M_p;
    local_1b8._M_dataplus._M_p = (pointer)0x0;
    de::details::
    UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::~UniqueBase((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                   *)&local_1b8);
    plVar2 = *(long **)&(this->super_BaseTestInstance).m_resource.
                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                        .m_data.field_0x8;
    (**(code **)(*plVar2 + 0x28))
              (&local_1b8,plVar2,(this->super_BaseTestInstance).m_opContext.m_physicalDevice,
               resource.
               super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
               .m_data.ptr);
    readOp.
    super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    .m_data.ptr = (Operation *)local_1b8._M_dataplus._M_p;
    local_1b8._M_dataplus._M_p = (pointer)0x0;
    de::details::
    UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::~UniqueBase((UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                   *)&local_1b8);
    ::vk::createCommandPool
              (cmdPool,vk,device,2,pQVar3[uVar10].familyIndexWrite,(VkAllocationCallbacks *)0x0);
    local_118 = pQVar3 + uVar10;
    ::vk::createCommandPool
              (cmdPool + 1,vk,device,2,local_118->familyIndexRead,(VkAllocationCallbacks *)0x0);
    makeCommandBuffer(ptrCmdBuffer,vk,device,
                      (VkCommandPool)
                      cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                      m_internal);
    makeCommandBuffer(ptrCmdBuffer + 1,vk,device,
                      (VkCommandPool)
                      cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                      m_internal);
    cmdBuffers[0] = ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    cmdBuffers[1] = ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)&local_1b8,vk,device,0,
               (VkAllocationCallbacks *)0x0);
    local_f8.m_data.deleter.m_device = (VkDevice)local_1b8.field_2._M_allocated_capacity;
    local_f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1b8.field_2._8_8_;
    local_f8.m_data.object.m_internal = (deUint64)local_1b8._M_dataplus._M_p;
    local_f8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_1b8._M_string_length;
    local_1b8._M_dataplus._M_p = (pointer)0x0;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_allocated_capacity = 0;
    local_1b8.field_2._8_8_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)4>_> *)&local_1b8);
    local_170[0] = 4;
    local_1b8._M_dataplus._M_p._0_4_ = 4;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_allocated_capacity =
         local_1b8.field_2._M_allocated_capacity & 0xffffffff00000000;
    local_1b8.field_2._8_8_ = 0;
    uStack_198 = 0;
    stageBits[0] = 1;
    local_178 = &local_f8;
    local_168 = 0;
    local_150 = stageBits;
    local_140 = cmdBuffers + 1;
    local_138 = 0;
    local_130 = 0;
    local_190 = stageBits[0];
    local_188 = cmdBuffers;
    local_180 = stageBits[0];
    local_160 = stageBits[0];
    local_158 = local_178;
    local_148 = stageBits[0];
    local_1c8.stageMask =
         (*(writeOp.
            super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
            .m_data.ptr)->_vptr_Operation[3])();
    pQVar3 = local_118;
    local_1c8.accessMask = extraout_var;
    local_1d8.stageMask =
         (*(readOp.
            super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
            .m_data.ptr)->_vptr_Operation[3])();
    local_1d8.accessMask = extraout_var_00;
    beginCommandBuffer(vk,cmdBuffers[0]);
    (*(writeOp.
       super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
       .m_data.ptr)->_vptr_Operation[2])
              (writeOp.
               super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
               .m_data.ptr,cmdBuffers[0]);
    createBarrierMultiQueue
              (vk,cmdBuffers,&local_1c8,&local_1d8,
               resource.
               super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
               .m_data.ptr,pQVar3->familyIndexWrite,pQVar3->familyIndexRead,
               *(VkSharingMode *)
                &(this->super_BaseTestInstance).m_writeOp.
                 super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 .m_data.ptr,false);
    endCommandBuffer(vk,cmdBuffers[0]);
    beginCommandBuffer(vk,cmdBuffers[1]);
    createBarrierMultiQueue
              (vk,cmdBuffers + 1,&local_1c8,&local_1d8,
               resource.
               super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
               .m_data.ptr,pQVar3->familyIndexWrite,pQVar3->familyIndexRead,
               *(VkSharingMode *)
                &(this->super_BaseTestInstance).m_writeOp.
                 super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 .m_data.ptr,true);
    (*(readOp.
       super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
       .m_data.ptr)->_vptr_Operation[2])
              (readOp.
               super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
               .m_data.ptr,cmdBuffers[1]);
    endCommandBuffer(vk,cmdBuffers[1]);
    VVar6 = (*vk->_vptr_DeviceInterface[2])(vk,pQVar3->queueWrite,1,&local_1b8);
    ::vk::checkResult(VVar6,
                      "vk.queueSubmit(queuePairs[pairNdx].queueWrite, 1u, &submitInfo[QUEUETYPE_WRITE], DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperationMultiQueueTests.cpp"
                      ,0x177);
    VVar6 = (*vk->_vptr_DeviceInterface[2])(vk,pQVar3->queueRead,1,local_170);
    ::vk::checkResult(VVar6,
                      "vk.queueSubmit(queuePairs[pairNdx].queueRead, 1u, &submitInfo[QUEUETYPE_READ], DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperationMultiQueueTests.cpp"
                      ,0x178);
    VVar6 = (*vk->_vptr_DeviceInterface[3])(vk,pQVar3->queueWrite);
    ::vk::checkResult(VVar6,"vk.queueWaitIdle(queuePairs[pairNdx].queueWrite)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperationMultiQueueTests.cpp"
                      ,0x179);
    VVar6 = (*vk->_vptr_DeviceInterface[3])(vk,pQVar3->queueRead);
    ::vk::checkResult(VVar6,"vk.queueWaitIdle(queuePairs[pairNdx].queueRead)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperationMultiQueueTests.cpp"
                      ,0x17a);
    iVar7 = (*(writeOp.
               super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
               .m_data.ptr)->_vptr_Operation[4])();
    (*(readOp.
       super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
       .m_data.ptr)->_vptr_Operation[4])();
    iVar7 = bcmp(__s1,__s2,CONCAT44(extraout_var_01,iVar7));
    if (iVar7 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Memory contents don\'t match",&local_239);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_f8);
    lVar9 = 0x20;
    do {
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                ((RefBase<vk::VkCommandBuffer_s_*> *)
                 ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object +
                 lVar9));
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != -0x20);
    lVar9 = 0x20;
    do {
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
                 ((long)&cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                         m_internal + lVar9));
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != -0x20);
    de::details::
    UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::~UniqueBase(&readOp.
                   super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 );
    de::details::
    UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
    ::~UniqueBase(&writeOp.
                   super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                 );
    de::details::
    UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
    ::~UniqueBase(&resource.
                   super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 );
    uVar10 = uVar10 + 1;
  } while (iVar7 == 0);
  std::
  vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  ::~vector(&queuePairs);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate (void)
	{
		enum {WRITE=0, READ, COUNT};
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					device				= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		const Unique<VkSemaphore>		semaphore			(createSemaphore (vk, device));
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
		VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[WRITE], *ptrCmdBuffer[READ]};
		const VkPipelineStageFlags		stageBits[]			= { VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT };
		const VkSubmitInfo				submitInfo[2]		=
															{
																{
																	VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType			sType;
																	DE_NULL,							// const void*				pNext;
																	0u,									// deUint32					waitSemaphoreCount;
																	DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
																	(const VkPipelineStageFlags*)DE_NULL,
																	1u,									// deUint32					commandBufferCount;
																	&cmdBuffers[WRITE],					// const VkCommandBuffer*	pCommandBuffers;
																	1u,									// deUint32					signalSemaphoreCount;
																	&semaphore.get(),					// const VkSemaphore*		pSignalSemaphores;
																},
																{
																	VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType				sType;
																	DE_NULL,							// const void*					pNext;
																	1u,									// deUint32						waitSemaphoreCount;
																	&semaphore.get(),					// const VkSemaphore*			pWaitSemaphores;
																	stageBits,							// const VkPipelineStageFlags*	pWaitDstStageMask;
																	1u,									// deUint32						commandBufferCount;
																	&cmdBuffers[READ],					// const VkCommandBuffer*		pCommandBuffers;
																	0u,									// deUint32						signalSemaphoreCount;
																	DE_NULL,							// const VkSemaphore*			pSignalSemaphores;
																}
															};
		const SyncInfo					writeSync			= m_writeOp->getSyncInfo();
		const SyncInfo					readSync			= m_readOp->getSyncInfo();

		beginCommandBuffer(vk, cmdBuffers[WRITE]);

		m_writeOp->recordCommands(cmdBuffers[WRITE]);

		if (m_resource->getType() == RESOURCE_TYPE_IMAGE)
		{
			const VkImageMemoryBarrier barrier =  makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				writeSync.imageLayout, readSync.imageLayout, m_resource->getImage().handle, m_resource->getImage().subresourceRange);
			vk.cmdPipelineBarrier(cmdBuffers[WRITE],  writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
		}

		endCommandBuffer(vk, cmdBuffers[WRITE]);

		beginCommandBuffer(vk, cmdBuffers[READ]);

		m_readOp->recordCommands(cmdBuffers[READ]);

		endCommandBuffer(vk, cmdBuffers[READ]);

		VK_CHECK(vk.queueSubmit(queue, 2u, submitInfo, DE_NULL));
		VK_CHECK(vk.queueWaitIdle(queue));

		{
			const Data	expected = m_writeOp->getData();
			const Data	actual	 = m_readOp->getData();

			if (0 != deMemCmp(expected.data, actual.data, expected.size))
				return tcu::TestStatus::fail("Memory contents don't match");
		}

		return tcu::TestStatus::pass("OK");
	}